

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_f6f6::PacketQueue<2097152UL>::sendTo
          (PacketQueue<2097152UL> *this,AVCodecContext *codecctx)

{
  AVPacket *pAVar1;
  void *this_00;
  undefined8 in_RSI;
  PacketQueue<2097152UL> *in_RDI;
  int ret;
  AVPacket *pkt;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  PacketQueue<2097152UL> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_4;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pAVar1 = getPacket(in_RDI,(unique_lock<std::mutex> *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (pAVar1 == (AVPacket *)0x0) {
    local_4 = avcodec_send_packet(in_RSI,0);
  }
  else {
    local_4 = avcodec_send_packet(in_RSI,pAVar1);
    if (local_4 != -0xb) {
      if (local_4 < 0) {
        in_stack_ffffffffffffff90 =
             (PacketQueue<2097152UL> *)
             std::operator<<((ostream *)&std::cerr,"Failed to send packet: ");
        this_00 = (void *)std::ostream::operator<<(in_stack_ffffffffffffff90,local_4);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      pop(in_stack_ffffffffffffff90);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff90);
  return local_4;
}

Assistant:

int sendTo(AVCodecContext *codecctx)
    {
        std::unique_lock<std::mutex> lock{mMutex};

        AVPacket *pkt{getPacket(lock)};
        if(!pkt) return avcodec_send_packet(codecctx, nullptr);

        const int ret{avcodec_send_packet(codecctx, pkt)};
        if(ret != AVERROR(EAGAIN))
        {
            if(ret < 0)
                std::cerr<< "Failed to send packet: "<<ret <<std::endl;
            pop();
        }
        return ret;
    }